

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall
TTD::SnapshotExtractor::MarkVisitStandardProperties(SnapshotExtractor *this,RecyclableObject *obj)

{
  bool bVar1;
  TypeId TVar2;
  int iVar3;
  DynamicObject *this_00;
  DynamicType *this_01;
  DynamicTypeHandler *pDVar4;
  ArrayObject *var;
  ArrayObject *parray;
  DynamicObject *dynObj;
  RecyclableObject *obj_local;
  SnapshotExtractor *this_local;
  
  TVar2 = Js::RecyclableObject::GetTypeId(obj);
  bVar1 = Js::DynamicType::Is(TVar2);
  if ((!bVar1) &&
     (iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])(), iVar3 != 0)) {
    TTDAbort_unrecoverable_error("Only dynamic objects should have standard properties.");
  }
  TVar2 = Js::RecyclableObject::GetTypeId(obj);
  bVar1 = Js::DynamicType::Is(TVar2);
  if (bVar1) {
    this_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    this_01 = Js::DynamicObject::GetDynamicType(this_00);
    pDVar4 = Js::DynamicType::GetTypeHandler(this_01);
    (*pDVar4->_vptr_DynamicTypeHandler[100])(pDVar4,this,this_00);
    var = Js::DynamicObject::GetObjectArray(this_00);
    if (var != (ArrayObject *)0x0) {
      MarkVisitVar(this,var);
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitStandardProperties(Js::RecyclableObject* obj)
    {
        TTDAssert(Js::DynamicType::Is(obj->GetTypeId()) || obj->GetPropertyCount() == 0, "Only dynamic objects should have standard properties.");

        if(Js::DynamicType::Is(obj->GetTypeId()))
        {
            Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(obj);

            dynObj->GetDynamicType()->GetTypeHandler()->MarkObjectSlots_TTD(this, dynObj);

            Js::ArrayObject* parray = dynObj->GetObjectArray();
            if(parray != nullptr)
            {
                this->MarkVisitVar(parray);
            }
        }
    }